

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmPostModify(LlvmCompilationContext *ctx,ExprPostModify *node)

{
  LLVMBuilderRef pLVar1;
  bool bVar2;
  int iVar3;
  LLVMValueRef pLVar4;
  TypeRef *pTVar5;
  LLVMValueRef pLVar6;
  TypeBase *type;
  LLVMTypeRef pLVar7;
  LLVMValueRef pLVar8;
  double local_60;
  TypeBase *stackType;
  LLVMValueRef result;
  LLVMValueRef value;
  TypeRef *refType;
  LLVMValueRef address;
  ExprPostModify *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar4 = CompileLlvm(ctx,node->value);
  pTVar5 = getType<TypeRef>(node->value->type);
  if (pTVar5 != (TypeRef *)0x0) {
    pLVar6 = LLVMBuildLoad(ctx->builder,pLVar4,"");
    pLVar6 = ConvertToStackType(ctx,pLVar6,pTVar5->subType);
    type = GetStackType(ctx,pTVar5->subType);
    bVar2 = ExpressionContext::IsIntegerType(ctx->ctx,type);
    if (bVar2) {
      pLVar1 = ctx->builder;
      pLVar7 = CompileLlvmType(ctx,type);
      iVar3 = -1;
      if ((node->isIncrement & 1U) != 0) {
        iVar3 = 1;
      }
      pLVar8 = LLVMConstInt(pLVar7,(long)iVar3,true);
      result = LLVMBuildAdd(pLVar1,pLVar6,pLVar8,"");
    }
    else {
      pLVar1 = ctx->builder;
      pLVar7 = CompileLlvmType(ctx,type);
      local_60 = 1.0;
      if ((node->isIncrement & 1U) == 0) {
        local_60 = -1.0;
      }
      pLVar8 = LLVMConstReal(pLVar7,local_60);
      result = LLVMBuildFAdd(pLVar1,pLVar6,pLVar8,"");
    }
    pLVar1 = ctx->builder;
    pLVar8 = ConvertToDataType(ctx,result,type,pTVar5->subType);
    LLVMBuildStore(pLVar1,pLVar8,pLVar4);
    pLVar4 = CheckType(ctx,&node->super_ExprBase,pLVar6);
    return pLVar4;
  }
  __assert_fail("refType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x32f,
                "LLVMValueRef CompileLlvmPostModify(LlvmCompilationContext &, ExprPostModify *)");
}

Assistant:

LLVMValueRef CompileLlvmPostModify(LlvmCompilationContext &ctx, ExprPostModify *node)
{
	LLVMValueRef address = CompileLlvm(ctx, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	LLVMValueRef value = ConvertToStackType(ctx, LLVMBuildLoad(ctx.builder, address, ""), refType->subType);
	LLVMValueRef result = value;

	TypeBase *stackType = GetStackType(ctx, refType->subType);

	if(ctx.ctx.IsIntegerType(stackType))
		value = LLVMBuildAdd(ctx.builder, value, LLVMConstInt(CompileLlvmType(ctx, stackType), node->isIncrement ? 1 : -1, true), "");
	else
		value = LLVMBuildFAdd(ctx.builder, value, LLVMConstReal(CompileLlvmType(ctx, stackType), node->isIncrement ? 1.0 : -1.0), "");

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, value, stackType, refType->subType), address);

	return CheckType(ctx, node, result);
}